

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O2

size_t __thiscall
capnp::_::PackedInputStream::tryRead
          (PackedInputStream *this,ArrayPtr<unsigned_char> dstArray,size_t minBytes)

{
  byte *pbVar1;
  ArrayPtr<const_unsigned_char> AVar2;
  long lVar3;
  PackedInputStream *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  byte bVar6;
  char *__nbytes;
  uint uVar7;
  uint uVar8;
  size_t maxBytes;
  size_t sVar9;
  size_t extraout_RDX;
  size_t __n;
  uchar *__n_00;
  byte *pbVar10;
  byte *pbVar11;
  uint uVar12;
  byte *pbVar13;
  byte *pbVar14;
  byte bVar15;
  long lVar16;
  uchar *__n_01;
  bool bVar17;
  ArrayPtr<const_unsigned_char> AVar18;
  uint runLength;
  byte *local_90;
  PackedInputStream *local_88;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Fault f;
  
  sVar9 = dstArray.size_;
  pbVar13 = dstArray.ptr;
  if (sVar9 == 0) {
    return 0;
  }
  iVar5 = (*(this->inner->super_InputStream)._vptr_InputStream[4])();
  AVar2.size_ = _kjCondition.left;
  AVar2.ptr = (uchar *)CONCAT44(extraout_var,iVar5);
  AVar18.size_ = extraout_RDX;
  AVar18.ptr = (uchar *)CONCAT44(extraout_var,iVar5);
  if (extraout_RDX == 0) {
    return 0;
  }
  pbVar1 = pbVar13 + sVar9;
  pbVar11 = pbVar13;
  local_90 = pbVar13;
  local_88 = this;
LAB_0018c97f:
  pPVar4 = local_88;
  _kjCondition.left = AVar2.size_;
  pbVar10 = AVar2.ptr;
  pbVar14 = AVar18.ptr + AVar18.size_;
  if ((ulong)((long)pbVar14 - (long)pbVar10) < 10) {
    if (pbVar13 + minBytes <= pbVar11) {
      (*(local_88->inner->super_InputStream)._vptr_InputStream[3])
                (local_88->inner,(long)pbVar10 - (long)AVar18.ptr);
      return (size_t)(pbVar11 + -(long)local_90);
    }
    if (pbVar14 == pbVar10) {
      (*(local_88->inner->super_InputStream)._vptr_InputStream[3])();
      AVar18 = kj::BufferedInputStream::getReadBuffer(pPVar4->inner);
      _kjCondition.left = AVar18.size_;
      _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
      _kjCondition.op.content.ptr = " > ";
      _kjCondition.op.content.size_ = 4;
      _kjCondition.result = _kjCondition.left != 0;
      AVar2 = AVar18;
      if (!_kjCondition.result) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[31]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                   ,0x4f,FAILED,"buffer.size() > 0",
                   "_kjCondition,\"Premature end of packed input.\"",&_kjCondition,
                   (char (*) [31])"Premature end of packed input.");
        lVar16 = -(long)local_90;
LAB_0018cda2:
        kj::_::Debug::Fault::~Fault(&f);
        return (size_t)(pbVar11 + lVar16);
      }
      goto LAB_0018c97f;
    }
    bVar15 = *pbVar10;
    pbVar10 = pbVar10 + 1;
    lVar16 = 0;
    while( true ) {
      pPVar4 = local_88;
      AVar2.size_ = _kjCondition.left;
      AVar2.ptr = pbVar10;
      if ((uint)lVar16 == 8) break;
      if ((bVar15 >> ((uint)lVar16 & 0x1f) & 1) == 0) {
        bVar6 = 0;
      }
      else {
        if (AVar18.ptr + AVar18.size_ == pbVar10) {
          (*(local_88->inner->super_InputStream)._vptr_InputStream[3])();
          AVar18 = kj::BufferedInputStream::getReadBuffer(pPVar4->inner);
          _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
          _kjCondition.op.content.ptr = " > ";
          _kjCondition.op.content.size_ = 4;
          bVar17 = AVar18.size_ == 0;
          _kjCondition.result = !bVar17;
          AVar2 = AVar18;
          if (bVar17) {
            iVar5 = 0x5b;
            goto LAB_0018cd8a;
          }
        }
        _kjCondition.left = AVar2.size_;
        bVar6 = *AVar2.ptr;
        pbVar10 = AVar2.ptr + 1;
      }
      pbVar11[lVar16] = bVar6;
      lVar16 = lVar16 + 1;
    }
    pbVar14 = pbVar11 + lVar16;
    if ((AVar18.ptr + AVar18.size_ == pbVar10) && ((byte)(bVar15 + 1) < 2)) {
      (*(local_88->inner->super_InputStream)._vptr_InputStream[3])();
      AVar18 = kj::BufferedInputStream::getReadBuffer(pPVar4->inner);
      _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
      _kjCondition.op.content.ptr = " > ";
      _kjCondition.op.content.size_ = 4;
      _kjCondition.result = AVar18.size_ != 0;
      AVar2 = AVar18;
      if (_kjCondition.result) goto LAB_0018cb0c;
      iVar5 = 100;
LAB_0018cd8a:
      _kjCondition.left = 0;
      _kjCondition.op.content.size_ = 4;
      _kjCondition.op.content.ptr = " > ";
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[31]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                 ,iVar5,FAILED,"buffer.size() > 0","_kjCondition,\"Premature end of packed input.\""
                 ,&_kjCondition,(char (*) [31])"Premature end of packed input.");
      lVar16 = lVar16 - (long)local_90;
      goto LAB_0018cda2;
    }
  }
  else {
    bVar15 = *pbVar10;
    bVar6 = pbVar10[1];
    if ((bVar15 & 1) == 0) {
      bVar6 = 0;
    }
    *pbVar11 = bVar6;
    lVar16 = (ulong)(bVar15 & 1) + 1;
    uVar7 = bVar15 >> 1 & 1;
    pbVar11[1] = -(char)uVar7 & pbVar10[(ulong)(bVar15 & 1) + 1];
    lVar3 = (ulong)uVar7 + lVar16;
    uVar12 = bVar15 >> 2 & 1;
    pbVar11[2] = -(char)uVar12 & pbVar10[(ulong)uVar7 + lVar16];
    lVar16 = (ulong)uVar12 + lVar3;
    uVar8 = bVar15 >> 3 & 1;
    pbVar11[3] = -(char)uVar8 & pbVar10[(ulong)uVar12 + lVar3];
    uVar7 = bVar15 >> 4 & 1;
    lVar3 = (ulong)uVar8 + lVar16;
    pbVar11[4] = -(char)uVar7 & pbVar10[(ulong)uVar8 + lVar16];
    lVar16 = (ulong)uVar7 + lVar3;
    uVar8 = bVar15 >> 5 & 1;
    pbVar11[5] = -(char)uVar8 & pbVar10[(ulong)uVar7 + lVar3];
    lVar3 = (ulong)uVar8 + lVar16;
    uVar7 = bVar15 >> 6 & 1;
    pbVar11[6] = -(char)uVar7 & pbVar10[(ulong)uVar8 + lVar16];
    pbVar11[7] = (char)bVar15 >> 7 & pbVar10[(ulong)uVar7 + lVar3];
    pbVar14 = pbVar11 + 8;
    AVar2.size_ = _kjCondition.left;
    AVar2.ptr = pbVar10 + (ulong)(bVar15 >> 7) + (ulong)uVar7 + lVar3;
  }
LAB_0018cb0c:
  pbVar11 = AVar2.ptr;
  if (bVar15 == 0xff) {
    __n_00 = (uchar *)((ulong)*pbVar11 * 8);
    runLength = (uint)__n_00;
    _kjCondition._8_8_ = (long)pbVar1 - (long)pbVar14;
    _kjCondition.left = (unsigned_long)&runLength;
    __nbytes = " <= ";
    _kjCondition.op.content.ptr = " <= ";
    _kjCondition.op.content.size_ = 5;
    bVar17 = (long)(_kjCondition._8_8_ + (ulong)*pbVar11 * -8) < 0;
    _kjCondition.result = SBORROW8(_kjCondition._8_8_,(long)__n_00) == bVar17;
    if (SBORROW8(_kjCondition._8_8_,(long)__n_00) != bVar17) {
      iVar5 = 0x8d;
LAB_0018ce51:
      _kjCondition.left = (unsigned_long)&runLength;
      _kjCondition.op.content.size_ = 5;
      _kjCondition.op.content.ptr = " <= ";
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,long>&,char_const(&)[56]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                 ,iVar5,FAILED,"runLength <= outEnd - out",
                 "_kjCondition,\"Packed input did not end cleanly on a segment boundary.\"",
                 (DebugComparison<unsigned_int_&,_long> *)&_kjCondition,
                 (char (*) [56])"Packed input did not end cleanly on a segment boundary.");
      lVar16 = -(long)local_90;
      kj::_::Debug::Fault::~Fault(&f);
      return (size_t)(pbVar14 + lVar16);
    }
    pbVar11 = pbVar11 + 1;
    __n_01 = AVar18.ptr + (AVar18.size_ - (long)pbVar11);
    if (__n_01 < __n_00) {
      memcpy(pbVar14,pbVar11,(size_t)__n_01);
      pPVar4 = local_88;
      runLength = runLength - (int)__n_01;
      (*(local_88->inner->super_InputStream)._vptr_InputStream[3])(local_88->inner,AVar18.size_);
      kj::InputStream::read
                (&pPVar4->inner->super_InputStream,(int)(pbVar14 + (long)__n_01),
                 (void *)(ulong)runLength,(size_t)__nbytes);
      pbVar11 = pbVar14 + (long)__n_01 + runLength;
      if (pbVar11 == pbVar1) {
        return sVar9;
      }
      AVar18 = kj::BufferedInputStream::getReadBuffer(pPVar4->inner);
      AVar2.size_ = _kjCondition.left;
      AVar2.ptr = AVar18.ptr;
      goto LAB_0018c97f;
    }
    memcpy(pbVar14,pbVar11,(size_t)__n_00);
    pbVar14 = pbVar14 + runLength;
    AVar2.size_ = _kjCondition.left;
    AVar2.ptr = pbVar11 + runLength;
  }
  else if (bVar15 == 0) {
    __n = (ulong)*pbVar11 * 8;
    runLength = (uint)__n;
    _kjCondition._8_8_ = (long)pbVar1 - (long)pbVar14;
    _kjCondition.left = (unsigned_long)&runLength;
    _kjCondition.op.content.ptr = " <= ";
    _kjCondition.op.content.size_ = 5;
    bVar17 = (long)(_kjCondition._8_8_ + (ulong)*pbVar11 * -8) < 0;
    _kjCondition.result = SBORROW8(_kjCondition._8_8_,__n) == bVar17;
    if (SBORROW8(_kjCondition._8_8_,__n) != bVar17) {
      iVar5 = 0x81;
      goto LAB_0018ce51;
    }
    memset(pbVar14,0,__n);
    AVar2.size_ = _kjCondition.left;
    AVar2.ptr = pbVar11 + 1;
    pbVar14 = pbVar14 + runLength;
  }
  _kjCondition.left = AVar2.size_;
  pbVar11 = pbVar14;
  if (pbVar14 == pbVar1) {
    (*(local_88->inner->super_InputStream)._vptr_InputStream[3])
              (local_88->inner,(long)AVar2.ptr - (long)AVar18.ptr);
    return sVar9;
  }
  goto LAB_0018c97f;
}

Assistant:

size_t PackedInputStream::tryRead(kj::ArrayPtr<byte> dstArray, size_t minBytes) {
  auto maxBytes = dstArray.size();
  uint8_t* const dst = dstArray.begin();
  if (maxBytes == 0) {
    return 0;
  }

  KJ_DREQUIRE(minBytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");
  KJ_DREQUIRE(maxBytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");

  uint8_t* __restrict__ out = dst;
  uint8_t* const outEnd = dst + maxBytes;
  uint8_t* const outMin = dst + minBytes;

  kj::ArrayPtr<const byte> buffer = inner.tryGetReadBuffer();
  if (buffer.size() == 0) {
    return 0;
  }
  const uint8_t* __restrict__ in = reinterpret_cast<const uint8_t*>(buffer.begin());

#define REFRESH_BUFFER() \
  inner.skip(buffer.size()); \
  buffer = inner.getReadBuffer(); \
  KJ_REQUIRE(buffer.size() > 0, "Premature end of packed input.") { \
    return out - dst; \
  } \
  in = reinterpret_cast<const uint8_t*>(buffer.begin())

#define BUFFER_END (reinterpret_cast<const uint8_t*>(buffer.end()))
#define BUFFER_REMAINING ((size_t)(BUFFER_END - in))

  for (;;) {
    uint8_t tag;

    KJ_DASSERT((out - dst) % sizeof(word) == 0,
           "Output pointer should always be aligned here.");

    if (BUFFER_REMAINING < 10) {
      if (out >= outMin) {
        // We read at least the minimum amount, so go ahead and return.
        inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
        return out - dst;
      }

      if (BUFFER_REMAINING == 0) {
        REFRESH_BUFFER();
        continue;
      }

      // We have at least 1, but not 10, bytes available.  We need to read slowly, doing a bounds
      // check on each byte.

      tag = *in++;

      for (uint i = 0; i < 8; i++) {
        if (tag & (1u << i)) {
          if (BUFFER_REMAINING == 0) {
            REFRESH_BUFFER();
          }
          *out++ = *in++;
        } else {
          *out++ = 0;
        }
      }

      if (BUFFER_REMAINING == 0 && (tag == 0 || tag == 0xffu)) {
        REFRESH_BUFFER();
      }
    } else {
      tag = *in++;

#define HANDLE_BYTE(n) \
      { \
         bool isNonzero = (tag & (1u << n)) != 0; \
         *out++ = *in & (-(int8_t)isNonzero); \
         in += isNonzero; \
      }

      HANDLE_BYTE(0);
      HANDLE_BYTE(1);
      HANDLE_BYTE(2);
      HANDLE_BYTE(3);
      HANDLE_BYTE(4);
      HANDLE_BYTE(5);
      HANDLE_BYTE(6);
      HANDLE_BYTE(7);
#undef HANDLE_BYTE
    }

    if (tag == 0) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= outEnd - out,
                 "Packed input did not end cleanly on a segment boundary.") {
        return out - dst;
      }
      memset(out, 0, runLength);
      out += runLength;

    } else if (tag == 0xffu) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= outEnd - out,
                 "Packed input did not end cleanly on a segment boundary.") {
        return out - dst;
      }

      size_t inRemaining = BUFFER_REMAINING;
      if (inRemaining >= runLength) {
        // Fast path.
        memcpy(out, in, runLength);
        out += runLength;
        in += runLength;
      } else {
        // Copy over the first buffer, then do one big read for the rest.
        memcpy(out, in, inRemaining);
        out += inRemaining;
        runLength -= inRemaining;

        inner.skip(buffer.size());
        inner.read(kj::arrayPtr(out, (size_t)runLength));
        out += runLength;

        if (out == outEnd) {
          return maxBytes;
        } else {
          buffer = inner.getReadBuffer();
          in = reinterpret_cast<const uint8_t*>(buffer.begin());

          // Skip the bounds check below since we just did the same check above.
          continue;
        }
      }
    }

    if (out == outEnd) {
      inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
      return maxBytes;
    }
  }

  KJ_FAIL_ASSERT("Can't get here.");
  return 0;  // GCC knows KJ_FAIL_ASSERT doesn't return, but Eclipse CDT still warns...

#undef REFRESH_BUFFER
}